

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.cpp
# Opt level: O1

string_t duckdb::StringVector::AddString(Vector *vector,string *data)

{
  pointer __src;
  undefined8 in_RCX;
  uint uVar1;
  anon_union_16_2_67f50693_for_value aVar2;
  string_t data_00;
  undefined4 uStack_14;
  undefined4 uStack_10;
  undefined4 uStack_c;
  
  __src = (data->_M_dataplus)._M_p;
  uVar1 = (uint)data->_M_string_length;
  if (uVar1 < 0xd) {
    uStack_c = 0;
    uStack_14 = 0;
    uStack_10 = 0;
    if (uVar1 != 0) {
      switchD_00b1522a::default(&uStack_14,__src,(ulong)(uVar1 & 0xf));
    }
  }
  else {
    uStack_14 = *(undefined4 *)__src;
    uStack_10 = SUB84(__src,0);
    uStack_c = (undefined4)((ulong)__src >> 0x20);
  }
  data_00.value._4_1_ = (undefined1)uStack_c;
  data_00.value._5_1_ = uStack_c._1_1_;
  data_00.value._6_1_ = uStack_c._2_1_;
  data_00.value._7_1_ = uStack_c._3_1_;
  data_00.value.pointer.length = uStack_10;
  data_00.value.pointer.ptr = (char *)in_RCX;
  aVar2.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)
       AddString((StringVector *)vector,(Vector *)CONCAT44(uStack_14,uVar1),data_00);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar2.pointer;
}

Assistant:

string_t StringVector::AddString(Vector &vector, const string &data) {
	return StringVector::AddString(vector, string_t(data.c_str(), UnsafeNumericCast<uint32_t>(data.size())));
}